

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O3

void same_stl_string_pointer_and_reference_are_equal(void)

{
  string *psVar1;
  Constraint_ *pCVar2;
  string alice_reference;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"alice","");
  alice_pointer_abi_cxx11_ = psVar1;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"alice","");
  psVar1 = alice_pointer_abi_cxx11_;
  pCVar2 = (Constraint_ *)
           cgreen::create_equal_to_string_constraint((string *)local_30,"alice_reference");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x92,"alice_pointer",(string *)psVar1,pCVar2);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

Ensure(same_stl_string_pointer_and_reference_are_equal) {
    alice_pointer = new std::string("alice");
    std::string alice_reference("alice");

    assert_that(alice_pointer, is_equal_to_string(alice_reference));
}